

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QByteArray>::data(QList<QByteArray> *this)

{
  QArrayDataPointer<QByteArray> *this_00;
  QByteArray *pQVar1;
  QArrayDataPointer<QByteArray> *in_RDI;
  
  detach((QList<QByteArray> *)0x382d9c);
  this_00 = (QArrayDataPointer<QByteArray> *)QArrayDataPointer<QByteArray>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QByteArray>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }